

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void AnalyzeModuleImport(ExpressionContext *ctx,SynModuleImport *syntax)

{
  int iVar1;
  ByteCode *bytecode;
  Lexeme *lexStream;
  InplaceStr name;
  uint lexStreamSize;
  TraceScope traceScope;
  uint local_4c;
  InplaceStr local_48;
  TraceScope local_38;
  
  name = GetModuleName(ctx->allocator,ctx->moduleRoot,syntax->path);
  if (AnalyzeModuleImport(ExpressionContext&,SynModuleImport*)::token == '\0') {
    iVar1 = __cxa_guard_acquire(&AnalyzeModuleImport(ExpressionContext&,SynModuleImport*)::token);
    if (iVar1 != 0) {
      AnalyzeModuleImport::token = NULLC::TraceGetToken("analyze","AnalyzeModuleImport");
      __cxa_guard_release(&AnalyzeModuleImport(ExpressionContext&,SynModuleImport*)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_38,AnalyzeModuleImport::token);
  NULLC::TraceLabel(name.begin,name.end);
  bytecode = (ByteCode *)BinaryCache::FindBytecode(name.begin,false);
  if (bytecode == (ByteCode *)0x0) {
    name = GetModuleName(ctx->allocator,(char *)0x0,syntax->path);
    bytecode = (ByteCode *)BinaryCache::FindBytecode(name.begin,false);
  }
  local_4c = 0;
  lexStream = BinaryCache::FindLexems(name.begin,false,&local_4c);
  if (bytecode != (ByteCode *)0x0) {
    local_48 = name;
    ImportModule(ctx,&syntax->super_SynBase,bytecode,lexStream,local_4c,name);
    NULLC::TraceScope::~TraceScope(&local_38);
    return;
  }
  anon_unknown.dwarf_94284::Stop
            (ctx,&syntax->super_SynBase,"ERROR: module import is not implemented");
}

Assistant:

void AnalyzeModuleImport(ExpressionContext &ctx, SynModuleImport *syntax)
{
	InplaceStr moduleName = GetModuleName(ctx.allocator, ctx.moduleRoot, syntax->path);

	TRACE_SCOPE("analyze", "AnalyzeModuleImport");
	TRACE_LABEL2(moduleName.begin, moduleName.end);

	const char *bytecode = BinaryCache::FindBytecode(moduleName.begin, false);

	if(!bytecode)
	{
		moduleName = GetModuleName(ctx.allocator, NULL, syntax->path);

		bytecode = BinaryCache::FindBytecode(moduleName.begin, false);
	}

	unsigned lexStreamSize = 0;
	Lexeme *lexStream = BinaryCache::FindLexems(moduleName.begin, false, lexStreamSize);

	if(!bytecode)
		Stop(ctx, syntax, "ERROR: module import is not implemented");

	ImportModule(ctx, syntax, (ByteCode*)bytecode, lexStream, lexStreamSize, moduleName);
}